

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

_Bool malloc_init_hard_a0_locked(void)

{
  _Bool _Var1;
  int iVar2;
  base_t *pbVar3;
  arena_t *paVar4;
  size_t sVar5;
  _Bool _Var6;
  char *pcVar7;
  char *opts_cache [5];
  uint bin_shard_sizes [36];
  char readlink_buf [4097];
  sc_data_t sc_data;
  hpa_shard_opts_t local_2a98;
  uint local_2a68 [36];
  char local_29d8 [4112];
  sc_data_t local_19c8;
  
  malloc_initializer = pthread_self();
  switchD_0105dc25::default(&local_19c8,0,0x19b0);
  duckdb_je_sc_boot(&local_19c8);
  duckdb_je_bin_shard_sizes_boot(local_2a68);
  local_29d8[0] = '\0';
  local_2a98.dirty_mult = 0;
  local_2a98.deferral_allowed = false;
  local_2a98._21_3_ = 0;
  local_2a98.hugify_delay_ms = 0;
  local_2a98.slab_max_alloc = 0;
  local_2a98.hugification_threshold = 0;
  local_2a98.min_purge_interval_ms = 0;
  malloc_conf_init_helper((sc_data_t *)0x0,(uint *)0x0,true,(char **)&local_2a98,local_29d8);
  malloc_conf_init_helper(&local_19c8,local_2a68,false,(char **)&local_2a98,(char *)0x0);
  if ((duckdb_je_opt_prof_leak_error == true) && (duckdb_je_opt_prof_final == false)) {
    duckdb_je_malloc_printf("<jemalloc>: prof_leak_error is set w/o prof_final.\n");
    if (duckdb_je_opt_abort_conf != false) goto LAB_01c63e24;
  }
  else {
    duckdb_je_opt_debug_double_free_max_scan = 0;
  }
  duckdb_je_san_init(duckdb_je_opt_lg_san_uaf_align);
  duckdb_je_sz_boot(&local_19c8,duckdb_je_opt_cache_oblivious);
  duckdb_je_bin_info_boot(&local_19c8,local_2a68);
  if (((duckdb_je_opt_stats_print == true) && (iVar2 = atexit(stats_print_atexit), iVar2 != 0)) &&
     (duckdb_je_malloc_write("<jemalloc>: Error in atexit()\n"), duckdb_je_opt_abort == true)) {
    abort();
  }
  _Var6 = true;
  _Var1 = duckdb_je_stats_boot();
  if (((!_Var1) && (_Var1 = duckdb_je_pages_boot(), !_Var1)) &&
     (_Var1 = duckdb_je_base_boot((tsdn_t *)0x0), !_Var1)) {
    pbVar3 = duckdb_je_b0get();
    _Var1 = duckdb_je_emap_init(&duckdb_je_arena_emap_global,pbVar3,true);
    if (_Var1) {
      return true;
    }
    _Var1 = duckdb_je_extent_boot();
    if (_Var1) {
      return true;
    }
    _Var1 = duckdb_je_ctl_boot();
    if (_Var1) {
      return true;
    }
    if ((duckdb_je_opt_hpa == true) && (_Var1 = duckdb_je_hpa_supported(), !_Var1)) {
      pcVar7 = "disabling";
      if (duckdb_je_opt_abort_conf != false) {
        pcVar7 = "aborting";
      }
      duckdb_je_malloc_printf
                ("<jemalloc>: HPA not supported in the current configuration; %s.",pcVar7);
      if (duckdb_je_opt_abort_conf == true) goto LAB_01c63e24;
      duckdb_je_opt_hpa = false;
    }
    pbVar3 = duckdb_je_b0get();
    _Var1 = duckdb_je_arena_boot(&local_19c8,pbVar3,duckdb_je_opt_hpa);
    if (!_Var1) {
      pbVar3 = duckdb_je_b0get();
      _Var1 = duckdb_je_tcache_boot((tsdn_t *)0x0,pbVar3);
      if ((!_Var1) &&
         (_Var1 = duckdb_je_malloc_mutex_init
                            (&duckdb_je_arenas_lock,"arenas",WITNESS_RANK_ARENAS,
                             malloc_mutex_rank_exclusive), !_Var1)) {
        duckdb_je_hook_boot();
        duckdb_je_narenas_auto = 1;
        duckdb_je_manual_arena_base = 2;
        duckdb_je_arenas[0].repr = (void *)0x0;
        paVar4 = duckdb_je_arena_init((tsdn_t *)0x0,0,&duckdb_je_arena_config_default);
        if (paVar4 != (arena_t *)0x0) {
          a0 = (arena_t *)duckdb_je_arenas[0];
          if (duckdb_je_arenas[0].repr == (void *)0x0) {
            a0 = (arena_t *)0x0;
          }
          if ((duckdb_je_opt_hpa != true) || (_Var1 = duckdb_je_hpa_supported(), _Var1)) {
            if (duckdb_je_opt_hpa == true) {
              local_2a98.min_purge_interval_ms = duckdb_je_opt_hpa_opts.min_purge_interval_ms;
              local_2a98.strict_min_purge_interval =
                   duckdb_je_opt_hpa_opts.strict_min_purge_interval;
              local_2a98._41_7_ = duckdb_je_opt_hpa_opts._41_7_;
              local_2a98.hugify_delay_ms = duckdb_je_opt_hpa_opts.hugify_delay_ms;
              local_2a98.slab_max_alloc = duckdb_je_opt_hpa_opts.slab_max_alloc;
              local_2a98.hugification_threshold = duckdb_je_opt_hpa_opts.hugification_threshold;
              local_2a98._21_3_ = duckdb_je_opt_hpa_opts._21_3_;
              local_2a98.dirty_mult = duckdb_je_opt_hpa_opts.dirty_mult;
              local_2a98._16_8_ =
                   CONCAT35(local_2a98._21_3_,
                            CONCAT14(duckdb_je_background_thread_enabled_state.repr,
                                     local_2a98.dirty_mult)) & 0xffffff01ffffffff;
              _Var1 = duckdb_je_pa_shard_enable_hpa
                                ((tsdn_t *)0x0,&a0->pa_shard,&local_2a98,&duckdb_je_opt_hpa_sec_opts
                                );
              if (_Var1) {
                return true;
              }
            }
          }
          else {
            duckdb_je_malloc_printf
                      ("<jemalloc>: HPA not supported in the current configuration; %s.");
            if (duckdb_je_opt_abort_conf == true) {
LAB_01c63e24:
              duckdb_je_malloc_printf
                        ("<jemalloc>: Abort (abort_conf:true) on invalid conf value (see above).\n")
              ;
              abort();
            }
            duckdb_je_opt_hpa = false;
          }
          duckdb_je_malloc_init_state = malloc_init_a0_initialized;
          sVar5 = strlen(local_29d8);
          if (sVar5 != 0) {
            pcVar7 = (char *)a0ialloc(sVar5 + 1,false,true);
            if (pcVar7 == (char *)0x0) {
              return false;
            }
            switchD_01602a8a::default(pcVar7,local_29d8,sVar5 + 1);
            duckdb_je_opt_malloc_conf_symlink = pcVar7;
          }
          _Var6 = false;
        }
      }
    }
  }
  return _Var6;
}

Assistant:

static bool
malloc_init_hard_a0_locked(void) {
	malloc_initializer = INITIALIZER;

	JEMALLOC_DIAGNOSTIC_PUSH
	JEMALLOC_DIAGNOSTIC_IGNORE_MISSING_STRUCT_FIELD_INITIALIZERS
	sc_data_t sc_data = {0};
	JEMALLOC_DIAGNOSTIC_POP

	/*
	 * Ordering here is somewhat tricky; we need sc_boot() first, since that
	 * determines what the size classes will be, and then
	 * malloc_conf_init(), since any slab size tweaking will need to be done
	 * before sz_boot and bin_info_boot, which assume that the values they
	 * read out of sc_data_global are final.
	 */
	sc_boot(&sc_data);
	unsigned bin_shard_sizes[SC_NBINS];
	bin_shard_sizes_boot(bin_shard_sizes);
	/*
	 * prof_boot0 only initializes opt_prof_prefix.  We need to do it before
	 * we parse malloc_conf options, in case malloc_conf parsing overwrites
	 * it.
	 */
	if (config_prof) {
		prof_boot0();
	}
	char readlink_buf[PATH_MAX + 1];
	readlink_buf[0] = '\0';
	malloc_conf_init(&sc_data, bin_shard_sizes, readlink_buf);
	san_init(opt_lg_san_uaf_align);
	sz_boot(&sc_data, opt_cache_oblivious);
	bin_info_boot(&sc_data, bin_shard_sizes);

	if (opt_stats_print) {
		/* Print statistics at exit. */
		if (atexit(stats_print_atexit) != 0) {
			malloc_write("<jemalloc>: Error in atexit()\n");
			if (opt_abort) {
				abort();
			}
		}
	}

	if (stats_boot()) {
		return true;
	}
	if (pages_boot()) {
		return true;
	}
	if (base_boot(TSDN_NULL)) {
		return true;
	}
	/* emap_global is static, hence zeroed. */
	if (emap_init(&arena_emap_global, b0get(), /* zeroed */ true)) {
		return true;
	}
	if (extent_boot()) {
		return true;
	}
	if (ctl_boot()) {
		return true;
	}
	if (config_prof) {
		prof_boot1();
	}
	if (opt_hpa && !hpa_supported()) {
		malloc_printf("<jemalloc>: HPA not supported in the current "
		    "configuration; %s.",
		    opt_abort_conf ? "aborting" : "disabling");
		if (opt_abort_conf) {
			malloc_abort_invalid_conf();
		} else {
			opt_hpa = false;
		}
	}
	if (arena_boot(&sc_data, b0get(), opt_hpa)) {
		return true;
	}
	if (tcache_boot(TSDN_NULL, b0get())) {
		return true;
	}
	if (malloc_mutex_init(&arenas_lock, "arenas", WITNESS_RANK_ARENAS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	hook_boot();
	/*
	 * Create enough scaffolding to allow recursive allocation in
	 * malloc_ncpus().
	 */
	narenas_auto = 1;
	manual_arena_base = narenas_auto + 1;
	memset(arenas, 0, sizeof(arena_t *) * narenas_auto);
	/*
	 * Initialize one arena here.  The rest are lazily created in
	 * arena_choose_hard().
	 */
	if (arena_init(TSDN_NULL, 0, &arena_config_default) == NULL) {
		return true;
	}
	a0 = arena_get(TSDN_NULL, 0, false);

	if (opt_hpa && !hpa_supported()) {
		malloc_printf("<jemalloc>: HPA not supported in the current "
		    "configuration; %s.",
		    opt_abort_conf ? "aborting" : "disabling");
		if (opt_abort_conf) {
			malloc_abort_invalid_conf();
		} else {
			opt_hpa = false;
		}
	} else if (opt_hpa) {
		hpa_shard_opts_t hpa_shard_opts = opt_hpa_opts;
		hpa_shard_opts.deferral_allowed = background_thread_enabled();
		if (pa_shard_enable_hpa(TSDN_NULL, &a0->pa_shard,
		    &hpa_shard_opts, &opt_hpa_sec_opts)) {
			return true;
		}
	}

	malloc_init_state = malloc_init_a0_initialized;

	size_t buf_len = strlen(readlink_buf);
	if (buf_len > 0) {
		void *readlink_allocated = a0ialloc(buf_len + 1, false, true);
		if (readlink_allocated != NULL) {
			memcpy(readlink_allocated, readlink_buf, buf_len + 1);
			opt_malloc_conf_symlink = readlink_allocated;
		}
	}

	return false;
}